

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall
mkvmuxer::Chapter::add_string(Chapter *this,char *title,char *language,char *country)

{
  Display *dst_ptr;
  int iVar1;
  Display *pDVar2;
  bool bVar3;
  
  bVar3 = ExpandDisplaysArray(this);
  if (bVar3) {
    pDVar2 = this->displays_;
    iVar1 = this->displays_count_;
    this->displays_count_ = iVar1 + 1;
    dst_ptr = pDVar2 + iVar1;
    pDVar2[iVar1].title_ = (char *)0x0;
    pDVar2[iVar1].language_ = (char *)0x0;
    pDVar2[iVar1].country_ = (char *)0x0;
    bVar3 = anon_unknown_12::StrCpy(title,&dst_ptr->title_);
    if (bVar3) {
      bVar3 = anon_unknown_12::StrCpy(language,&dst_ptr->language_);
      if (bVar3) {
        bVar3 = anon_unknown_12::StrCpy(country,&dst_ptr->country_);
        return bVar3;
      }
    }
  }
  return false;
}

Assistant:

bool Chapter::add_string(const char* title, const char* language,
                         const char* country) {
  if (!ExpandDisplaysArray())
    return false;

  Display& d = displays_[displays_count_++];
  d.Init();

  if (!d.set_title(title))
    return false;

  if (!d.set_language(language))
    return false;

  if (!d.set_country(country))
    return false;

  return true;
}